

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void ft_var_load_mvar(TT_Face face)

{
  FT_UInt16 FVar1;
  FT_Error FVar2;
  FT_UInt32 FVar3;
  FT_ULong FVar4;
  FT_Pointer pvVar5;
  FT_ULong pos;
  FT_Short *pFVar6;
  GX_Value local_80;
  GX_Value local_78;
  FT_Short *p;
  FT_ULong records_offset;
  FT_UShort store_offset;
  FT_ULong table_offset;
  FT_ULong table_len;
  FT_UShort majorVersion;
  GX_Value pGStack_40;
  FT_Error error;
  GX_Value limit;
  GX_Value value;
  GX_ItemVarStore itemStore;
  GX_Blend blend;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  blend = (GX_Blend)((FT_Stream)memory)->memory;
  itemStore = (GX_ItemVarStore)face->blend;
  stream = (FT_Stream)face;
  table_len._4_4_ = (*face->goto_table)(face,0x4d564152,(FT_Stream)memory,&table_offset);
  if (table_len._4_4_ == 0) {
    FVar4 = FT_Stream_Pos((FT_Stream)memory);
    table_len._2_2_ = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&table_len + 4));
    if (((table_len._4_4_ == 0) &&
        (table_len._4_4_ = FT_Stream_Skip((FT_Stream)memory,2), table_len._4_4_ == 0)) &&
       (table_len._2_2_ == 1)) {
      pvVar5 = ft_mem_alloc((FT_Memory)blend,0x30,(FT_Error *)((long)&table_len + 4));
      *(FT_Pointer *)(itemStore + 3) = pvVar5;
      if ((table_len._4_4_ == 0) &&
         (table_len._4_4_ = FT_Stream_Skip((FT_Stream)memory,4), table_len._4_4_ == 0)) {
        FVar1 = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&table_len + 4));
        **(FT_UInt16 **)(itemStore + 3) = FVar1;
        if ((table_len._4_4_ == 0) &&
           (FVar1 = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&table_len + 4)),
           table_len._4_4_ == 0)) {
          pos = FT_Stream_Pos((FT_Stream)memory);
          table_len._4_4_ =
               tt_var_load_item_variation_store
                         ((TT_Face)stream,FVar4 + FVar1,
                          (GX_ItemVarStore)(*(long *)(itemStore + 3) + 8));
          if (table_len._4_4_ == 0) {
            pvVar5 = ft_mem_realloc((FT_Memory)blend,0x10,0,(ulong)**(ushort **)(itemStore + 3),
                                    (void *)0x0,(FT_Error *)((long)&table_len + 4));
            *(FT_Pointer *)(*(long *)(itemStore + 3) + 0x28) = pvVar5;
            if (((table_len._4_4_ == 0) &&
                (table_len._4_4_ = FT_Stream_Seek((FT_Stream)memory,pos), table_len._4_4_ == 0)) &&
               (FVar2 = FT_Stream_EnterFrame
                                  ((FT_Stream)memory,
                                   (long)(int)((uint)**(ushort **)(itemStore + 3) << 3)), FVar2 == 0
               )) {
              limit = *(GX_Value *)(*(long *)(itemStore + 3) + 0x28);
              if (limit == (GX_Value)0x0) {
                local_78 = (GX_Value)0x0;
              }
              else {
                local_78 = limit + (int)(uint)**(ushort **)(itemStore + 3);
              }
              pGStack_40 = local_78;
              value = (GX_Value)(*(long *)(itemStore + 3) + 8);
              table_len._4_4_ = 0;
              for (; limit < pGStack_40; limit = limit + 1) {
                FVar3 = FT_Stream_GetULong((FT_Stream)memory);
                limit->tag = (ulong)FVar3;
                FVar1 = FT_Stream_GetUShort((FT_Stream)memory);
                limit->outerIndex = FVar1;
                FVar1 = FT_Stream_GetUShort((FT_Stream)memory);
                limit->innerIndex = FVar1;
                if (((limit->outerIndex != 0xffff) || (limit->innerIndex != 0xffff)) &&
                   (((uint)value->tag <= (uint)limit->outerIndex ||
                    (*(uint *)(*(long *)&value->outerIndex + (ulong)limit->outerIndex * 0x18) <=
                     (uint)limit->innerIndex)))) {
                  table_len._4_4_ = 8;
                  break;
                }
              }
              FT_Stream_ExitFrame((FT_Stream)memory);
              if (table_len._4_4_ == 0) {
                limit = *(GX_Value *)(*(long *)(itemStore + 3) + 0x28);
                if (limit == (GX_Value)0x0) {
                  local_80 = (GX_Value)0x0;
                }
                else {
                  local_80 = limit + (int)(uint)**(ushort **)(itemStore + 3);
                }
                pGStack_40 = local_80;
                for (; limit < pGStack_40; limit = limit + 1) {
                  pFVar6 = ft_var_get_value_pointer((TT_Face)stream,limit->tag);
                  if (pFVar6 != (FT_Short *)0x0) {
                    limit->unmodified = *pFVar6;
                  }
                }
                *(uint *)&stream[0xf].descriptor = *(uint *)&stream[0xf].descriptor | 0x100;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
  ft_var_load_mvar( TT_Face  face )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    GX_Blend         blend = face->blend;
    GX_ItemVarStore  itemStore;
    GX_Value         value, limit;

    FT_Error   error;
    FT_UShort  majorVersion;
    FT_ULong   table_len;
    FT_ULong   table_offset;
    FT_UShort  store_offset;
    FT_ULong   records_offset;


    FT_TRACE2(( "MVAR " ));

    error = face->goto_table( face, TTAG_MVAR, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      return;
    }

    table_offset = FT_STREAM_POS();

    /* skip minor version */
    if ( FT_READ_USHORT( majorVersion ) ||
         FT_STREAM_SKIP( 2 )            )
      return;

    if ( majorVersion != 1 )
    {
      FT_TRACE2(( "bad table version %d\n", majorVersion ));
      return;
    }

    if ( FT_NEW( blend->mvar_table ) )
      return;

    /* skip reserved entry and value record size */
    if ( FT_STREAM_SKIP( 4 )                             ||
         FT_READ_USHORT( blend->mvar_table->valueCount ) ||
         FT_READ_USHORT( store_offset )                  )
      return;

    records_offset = FT_STREAM_POS();

    error = tt_var_load_item_variation_store(
              face,
              table_offset + store_offset,
              &blend->mvar_table->itemStore );
    if ( error )
      return;

    if ( FT_NEW_ARRAY( blend->mvar_table->values,
                       blend->mvar_table->valueCount ) )
      return;

    if ( FT_STREAM_SEEK( records_offset )                                ||
         FT_FRAME_ENTER( blend->mvar_table->valueCount * GX_VALUE_SIZE ) )
      return;

    value     = blend->mvar_table->values;
    limit     = FT_OFFSET( value, blend->mvar_table->valueCount );
    itemStore = &blend->mvar_table->itemStore;

    for ( ; value < limit; value++ )
    {
      value->tag        = FT_GET_ULONG();
      value->outerIndex = FT_GET_USHORT();
      value->innerIndex = FT_GET_USHORT();

      /* new in OpenType 1.8.4 */
      if ( value->outerIndex == 0xFFFFU && value->innerIndex == 0xFFFFU )
      {
        /* no variation data for this item */
        continue;
      }

      if ( value->outerIndex >= itemStore->dataCount                  ||
           value->innerIndex >= itemStore->varData[value->outerIndex]
                                                  .itemCount          )
      {
        error = FT_THROW( Invalid_Table );
        break;
      }
    }

    FT_FRAME_EXIT();

    if ( error )
      return;

    FT_TRACE2(( "loaded\n" ));

    value = blend->mvar_table->values;
    limit = FT_OFFSET( value, blend->mvar_table->valueCount );

    /* save original values of the data MVAR is going to modify */
    for ( ; value < limit; value++ )
    {
      FT_Short*  p = ft_var_get_value_pointer( face, value->tag );


      if ( p )
        value->unmodified = *p;
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE1(( "ft_var_load_mvar: Ignoring unknown tag `%c%c%c%c'\n",
                    (FT_Char)( value->tag >> 24 ),
                    (FT_Char)( value->tag >> 16 ),
                    (FT_Char)( value->tag >> 8 ),
                    (FT_Char)( value->tag ) ));
#endif
    }

    face->variation_support |= TT_FACE_FLAG_VAR_MVAR;
  }